

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,H10 *hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  int *piVar1;
  ulong max_backward_limit;
  ushort uVar2;
  ushort uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  void *p;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  uint32_t *puVar15;
  long lVar16;
  ZopfliNode *array;
  size_t sVar17;
  uint32_t uVar18;
  ulong uVar19;
  uint8_t *puVar20;
  size_t sVar21;
  ulong uVar22;
  uint8_t *puVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  size_t length;
  int *data;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  uint8_t *puVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  ulong local_2f70;
  ulong local_2f68;
  int *local_2f60;
  uint local_2f50;
  ulong local_2f40;
  ulong local_2f28;
  void *local_2f18;
  ulong local_2f10;
  size_t local_2ef0;
  long local_2ee0;
  long local_2ed8;
  uint local_2ed0;
  ulong local_2eb8;
  int orig_dist_cache [4];
  uint32_t histogram_cmd [704];
  uint32_t histogram_literal [256];
  float cost_literal [256];
  ZopfliCostModel model;
  uint32_t histogram_dist [520];
  
  iVar10 = params->lgwin;
  if (num_bytes == 0) {
    local_2f18 = (void *)0x0;
    local_2ef0 = 0;
    p = (void *)0x0;
    local_2eb8 = position;
  }
  else {
    local_2ef0 = num_bytes * 4;
    local_2f18 = BrotliAllocate(m,local_2ef0);
    p = (void *)0x0;
    pvVar13 = (void *)(num_bytes - 0x7f);
    if (num_bytes < 0x7f) {
      pvVar13 = p;
    }
    local_2eb8 = (long)pvVar13 + position;
    if (local_2ef0 == 0) {
      local_2ef0 = 0;
    }
    else {
      p = BrotliAllocate(m,num_bytes << 5);
    }
  }
  max_backward_limit = (1L << ((byte)iVar10 & 0x3f)) - 0x10;
  lVar16 = 0;
  local_2f10 = 0;
  do {
    if (num_bytes <= lVar16 + 3U) {
      sVar4 = *num_literals;
      sVar5 = *last_insert_len;
      uVar7 = *(undefined8 *)dist_cache;
      uVar8 = *(undefined8 *)(dist_cache + 2);
      sVar6 = *num_commands;
      length = num_bytes + 1;
      if (length == 0) {
        array = (ZopfliNode *)0x0;
      }
      else {
        array = (ZopfliNode *)BrotliAllocate(m,length * 0x10);
      }
      InitZopfliCostModel(m,&model,num_bytes);
      for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
        BrotliInitZopfliNodes(array,length);
        if (lVar16 == 0) {
          ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
        }
        else {
          sVar21 = *num_commands;
          memset(histogram_literal,0,0x400);
          memset(histogram_cmd,0,0xb00);
          memset(histogram_dist,0,0x820);
          uVar19 = position - sVar5;
          for (lVar32 = 0; lVar32 != sVar21 - sVar6; lVar32 = lVar32 + 1) {
            uVar34 = commands[lVar32].insert_len_;
            uVar11 = commands[lVar32].copy_len_;
            uVar2 = commands[lVar32].dist_prefix_;
            uVar3 = commands[lVar32].cmd_prefix_;
            histogram_cmd[uVar3] = histogram_cmd[uVar3] + 1;
            if (0x7f < uVar3) {
              histogram_dist[uVar2] = histogram_dist[uVar2] + 1;
            }
            uVar26 = (ulong)uVar34;
            uVar12 = uVar19;
            while (bVar37 = uVar26 != 0, uVar26 = uVar26 - 1, bVar37) {
              histogram_literal[ringbuffer[uVar12 & ringbuffer_mask]] =
                   histogram_literal[ringbuffer[uVar12 & ringbuffer_mask]] + 1;
              uVar12 = uVar12 + 1;
            }
            uVar19 = uVar19 + uVar34 + (ulong)(uVar11 & 0xffffff);
          }
          SetCost(histogram_literal,0x100,cost_literal);
          SetCost(histogram_cmd,0x2c0,model.cost_cmd_);
          SetCost(histogram_dist,0x208,model.cost_dist_);
          model.min_cost_cmd_ = 1.7e+38;
          for (lVar32 = 0; lVar32 != 0x2c0; lVar32 = lVar32 + 1) {
            if (model.cost_cmd_[lVar32] <= model.min_cost_cmd_) {
              model.min_cost_cmd_ = model.cost_cmd_[lVar32];
            }
          }
          *model.literal_costs_ = 0.0;
          fVar38 = 0.0;
          for (sVar21 = 0; model.num_bytes_ != sVar21; sVar21 = sVar21 + 1) {
            fVar38 = fVar38 + cost_literal[ringbuffer[position + sVar21 & ringbuffer_mask]];
            model.literal_costs_[sVar21 + 1] = fVar38;
          }
        }
        *num_commands = sVar6;
        *num_literals = sVar4;
        *last_insert_len = sVar5;
        *(undefined8 *)dist_cache = uVar7;
        *(undefined8 *)(dist_cache + 2) = uVar8;
        uVar34 = 0x145;
        if (params->quality < 0xb) {
          uVar34 = 0x96;
        }
        array->length = 0;
        (array->u).cost = 0.0;
        histogram_cmd[0x40] = 0;
        histogram_cmd[0x41] = 0;
        lVar32 = 0;
        for (sVar21 = 0; sVar21 + 3 < num_bytes; sVar21 = sVar21 + 1) {
          sVar17 = UpdateNodes(num_bytes,position,sVar21,ringbuffer,ringbuffer_mask,params,
                               max_backward_limit,dist_cache,
                               (ulong)*(uint *)((long)local_2f18 + sVar21 * 4),
                               (BackwardMatch *)(lVar32 * 8 + (long)p),&model,
                               (StartPosQueue *)histogram_cmd,array);
          uVar19 = 0;
          if (0x3fff < sVar17) {
            uVar19 = sVar17;
          }
          uVar26 = (ulong)*(uint *)((long)local_2f18 + sVar21 * 4);
          lVar32 = lVar32 + uVar26;
          if (((uVar26 == 1) &&
              (uVar11 = *(uint *)((long)p + lVar32 * 8 + -4) >> 5, uVar34 < uVar11)) &&
             (uVar19 < uVar11)) {
            uVar19 = (ulong)uVar11;
          }
          if (1 < uVar19) {
            while ((uVar19 = uVar19 - 1, uVar19 != 0 &&
                   (uVar26 = sVar21 + 4, sVar21 = sVar21 + 1, uVar26 < num_bytes))) {
              EvaluateNode(position,sVar21,max_backward_limit,dist_cache,&model,
                           (StartPosQueue *)histogram_cmd,array);
              lVar32 = lVar32 + (ulong)*(uint *)((long)local_2f18 + sVar21 * 4);
            }
          }
        }
        sVar21 = ComputeShortestPathFromNodes(num_bytes,array);
        *num_commands = *num_commands + sVar21;
        BrotliZopfliCreateCommands
                  (num_bytes,position,max_backward_limit,array,dist_cache,last_insert_len,commands,
                   num_literals);
      }
      BrotliFree(m,model.literal_costs_);
      model.literal_costs_ = (float *)0x0;
      BrotliFree(m,array);
      BrotliFree(m,p);
      BrotliFree(m,local_2f18);
      return;
    }
    uVar19 = lVar16 + position;
    uVar26 = max_backward_limit;
    if (uVar19 < max_backward_limit) {
      uVar26 = uVar19;
    }
    uVar12 = local_2f10 + 0x80;
    if (local_2ef0 < uVar12) {
      sVar4 = local_2ef0;
      if (local_2ef0 == 0) {
        sVar4 = uVar12;
      }
      do {
        uVar24 = sVar4;
        sVar4 = uVar24 * 2;
      } while (uVar24 < uVar12);
      pvVar13 = BrotliAllocate(m,uVar24 * 8);
      if (local_2ef0 != 0) {
        memcpy(pvVar13,p,local_2ef0 << 3);
      }
      BrotliFree(m,p);
      p = pvVar13;
      local_2ef0 = uVar24;
    }
    uVar24 = num_bytes - lVar16;
    uVar12 = 0x10;
    if (params->quality == 0xb) {
      uVar12 = 0x40;
    }
    piVar1 = (int *)((long)p + local_2f10 * 8);
    uVar14 = 0;
    if (uVar12 <= uVar19) {
      uVar14 = uVar19 - uVar12;
    }
    data = (int *)(ringbuffer + (uVar19 & ringbuffer_mask));
    uVar12 = uVar19;
    uVar36 = 1;
    local_2f60 = piVar1;
    while (((uVar12 = uVar12 - 1, uVar14 < uVar12 && (uVar36 < 3)) && (uVar19 - uVar12 <= uVar26)))
    {
      uVar28 = uVar12 & ringbuffer_mask;
      if (((uint8_t)*data == ringbuffer[uVar28]) &&
         (*(uint8_t *)((long)data + 1) == ringbuffer[uVar28 + 1])) {
        uVar30 = 0;
        lVar32 = 0;
LAB_0010ece5:
        uVar22 = uVar24 & 0xfffffffffffffff8;
        uVar25 = (ulong)((uint)uVar24 & 7);
        if (uVar24 >> 3 == uVar30) {
          for (; (uVar30 = uVar24, uVar25 != 0 &&
                 (uVar30 = uVar22, ringbuffer[uVar22 + uVar28] == *(uint8_t *)((long)data + uVar22))
                 ); uVar22 = uVar22 + 1) {
            uVar25 = uVar25 - 1;
          }
        }
        else {
          if (*(ulong *)(data + uVar30 * 2) == *(ulong *)(ringbuffer + uVar30 * 8 + uVar28))
          goto code_r0x0010ecfc;
          uVar30 = *(ulong *)(ringbuffer + uVar30 * 8 + uVar28) ^ *(ulong *)(data + uVar30 * 2);
          uVar28 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar30 = (uVar28 >> 3 & 0x1fffffff) - lVar32;
        }
        if (uVar36 < uVar30) {
          *local_2f60 = (int)(uVar19 - uVar12);
          local_2f60[1] = (int)uVar30 << 5;
          local_2f60 = local_2f60 + 2;
          uVar36 = uVar30;
        }
      }
    }
    uVar34 = (uint)ringbuffer_mask;
    if (uVar36 < uVar24) {
      uVar9 = (uint)(*data * 0x1e35a7bd) >> 0xf;
      uVar11 = hasher->buckets_[uVar9];
      uVar12 = uVar24;
      if (0x7f < uVar24) {
        hasher->buckets_[uVar9] = (uint32_t)uVar19;
        uVar12 = 0x80;
      }
      uVar14 = hasher->window_mask_;
      uVar28 = uVar14 & uVar19;
      local_2ed8 = uVar28 * 2 + 1;
      local_2ee0 = uVar28 * 2;
      local_2f28 = 0;
      local_2f40 = 0;
      lVar32 = 0x40;
      while (uVar28 = uVar19 - uVar11, uVar28 != 0) {
        bVar37 = lVar32 == 0;
        lVar32 = lVar32 + -1;
        if ((uVar26 < uVar28) || (bVar37)) break;
        uVar30 = local_2f40;
        if (local_2f28 < local_2f40) {
          uVar30 = local_2f28;
        }
        if (0x80 < uVar30) {
LAB_0010fbaf:
          __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0x9d,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        puVar35 = ringbuffer + (uVar11 & uVar34);
        uVar22 = uVar24 - uVar30;
        uVar25 = uVar22 & 0xfffffffffffffff8;
        uVar29 = 0;
        lVar31 = 0;
LAB_0010ee90:
        if (uVar22 >> 3 == uVar29) {
          uVar33 = (ulong)((uint)uVar22 & 7);
          puVar23 = puVar35 + (uVar30 - lVar31);
          for (; (bVar37 = uVar33 != 0, uVar33 = uVar33 - 1, uVar29 = uVar22, bVar37 &&
                 (uVar29 = uVar25, *(uint8_t *)((long)data + uVar25 + uVar30) == *puVar23));
              uVar25 = uVar25 + 1) {
            puVar23 = puVar23 + 1;
          }
        }
        else {
          uVar33 = *(ulong *)((long)data + uVar29 * 8 + uVar30);
          if (*(ulong *)(puVar35 + uVar29 * 8 + uVar30) == uVar33) goto code_r0x0010eeaf;
          uVar33 = uVar33 ^ *(ulong *)(puVar35 + uVar29 * 8 + uVar30);
          uVar22 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar29 = (uVar22 >> 3 & 0x1fffffff) - lVar31;
        }
        uVar29 = uVar29 + uVar30;
        iVar10 = bcmp(data,puVar35,uVar29);
        if (iVar10 != 0) {
LAB_0010fbce:
          __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0xa2,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        if (local_2f60 == (int *)0x0) {
          local_2f60 = (int *)0x0;
        }
        else if (uVar36 < uVar29) {
          *local_2f60 = (int)uVar28;
          local_2f60[1] = (int)uVar29 << 5;
          local_2f60 = local_2f60 + 2;
          uVar36 = uVar29;
        }
        local_2ed0 = (uint)uVar14;
        if (uVar12 <= uVar29) {
          if (uVar24 < 0x80) goto LAB_0010f092;
          puVar15 = hasher->forest_;
          puVar15[local_2ee0] = puVar15[(ulong)(local_2ed0 & uVar11) * 2];
          uVar18 = puVar15[(ulong)(local_2ed0 & uVar11) * 2 + 1];
          goto LAB_0010f071;
        }
        puVar15 = hasher->forest_;
        if (puVar35[uVar29] < *(byte *)((long)data + uVar29)) {
          if (0x7f < uVar24) {
            puVar15[local_2ee0] = uVar11;
          }
          lVar31 = (ulong)(uVar11 & local_2ed0) * 2 + 1;
          local_2f28 = uVar29;
          local_2ee0 = lVar31;
        }
        else {
          if (0x7f < uVar24) {
            puVar15[local_2ed8] = uVar11;
          }
          lVar31 = (ulong)(uVar11 & local_2ed0) * 2;
          local_2f40 = uVar29;
          local_2ed8 = lVar31;
        }
        uVar11 = puVar15[lVar31];
      }
      if (0x7f < uVar24) {
        uVar18 = hasher->invalid_pos_;
        puVar15 = hasher->forest_;
        puVar15[local_2ee0] = uVar18;
LAB_0010f071:
        puVar15[local_2ed8] = uVar18;
      }
    }
LAB_0010f092:
    for (lVar32 = 0; lVar32 != 0x26; lVar32 = lVar32 + 1) {
      histogram_cmd[lVar32] = 0xfffffff;
    }
    uVar12 = uVar36 + 1;
    if (uVar36 + 1 < 5) {
      uVar12 = 4;
    }
    iVar10 = BrotliFindAllStaticDictionaryMatches((uint8_t *)data,uVar12,uVar24,histogram_cmd);
    if (iVar10 != 0) {
      if (0x24 < uVar24) {
        uVar24 = 0x25;
      }
      iVar10 = (int)uVar12 << 5;
      for (; uVar12 <= uVar24; uVar12 = uVar12 + 1) {
        uVar11 = histogram_cmd[uVar12];
        if (uVar11 < 0xfffffff) {
          uVar9 = uVar11 & 0x1f;
          *local_2f60 = (uVar11 >> 5) + (int)uVar26 + 1;
          if (uVar12 == uVar9) {
            uVar9 = 0;
          }
          local_2f60[1] = uVar9 + iVar10;
          local_2f60 = local_2f60 + 2;
        }
        iVar10 = iVar10 + 0x20;
      }
    }
    lVar32 = (long)local_2f60 - (long)piVar1 >> 3;
    uVar12 = lVar32 + local_2f10;
    uVar24 = local_2f10;
    while (uVar24 = uVar24 + 1, uVar24 < uVar12) {
      if (*(uint *)((long)p + uVar24 * 8 + 4) >> 5 <= *(uint *)((long)p + uVar24 * 8 + -4) >> 5) {
        __assert_fail("BackwardMatchLength(&matches[j]) < BackwardMatchLength(&matches[j + 1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/backward_references_hq.c"
                      ,0x2d3,
                      "void BrotliCreateHqZopfliBackwardReferences(MemoryManager *, size_t, size_t, const uint8_t *, size_t, const BrotliEncoderParams *, H10 *, int *, size_t *, Command *, size_t *, size_t *)"
                     );
      }
      uVar11 = *(uint *)((long)p + uVar24 * 8 + -8);
      if ((uVar11 <= uVar26) && (*(uint *)((long)p + uVar24 * 8) < uVar11)) {
        __assert_fail("matches[j].distance > max_distance || matches[j].distance <= matches[j + 1].distance"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/backward_references_hq.c"
                      ,0x2d5,
                      "void BrotliCreateHqZopfliBackwardReferences(MemoryManager *, size_t, size_t, const uint8_t *, size_t, const BrotliEncoderParams *, H10 *, int *, size_t *, Command *, size_t *, size_t *)"
                     );
      }
    }
    *(int *)((long)local_2f18 + lVar16 * 4) = (int)lVar32;
    uVar26 = local_2f10;
    if ((local_2f60 != piVar1) &&
       (uVar11 = *(uint *)((long)p + uVar12 * 8 + -4), uVar26 = uVar12, 0x28bf < uVar11)) {
      uVar24 = (ulong)(uVar11 >> 5);
      *(undefined8 *)((long)p + local_2f10 * 8) = *(undefined8 *)((long)p + uVar12 * 8 + -8);
      uVar26 = uVar19 + 1;
      uVar12 = uVar24 + uVar19;
      lVar32 = uVar24 - 1;
      if (local_2eb8 <= uVar12) {
        uVar12 = local_2eb8;
      }
      uVar24 = uVar12 - 0x3f;
      if (uVar12 < uVar19 + 0x40) {
        uVar24 = uVar26;
      }
      *(undefined4 *)((long)local_2f18 + lVar16 * 4) = 1;
      if (uVar19 + 0x201 <= uVar24) {
        for (; uVar26 < uVar24; uVar26 = uVar26 + 8) {
          uVar19 = hasher->window_mask_;
          puVar35 = ringbuffer + (uVar26 & ringbuffer_mask);
          uVar9 = (uint)(*(int *)(ringbuffer + (uVar26 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
          uVar11 = hasher->buckets_[uVar9];
          local_2f68 = (uVar19 & uVar26) * 2 + 1;
          local_2f70 = (uVar19 & uVar26) * 2;
          hasher->buckets_[uVar9] = (uint32_t)uVar26;
          uVar14 = 0;
          lVar31 = 0x40;
          uVar36 = 0;
          while (uVar26 != uVar11) {
            bVar37 = lVar31 == 0;
            lVar31 = lVar31 + -1;
            if ((uVar19 - 0xf < uVar26 - uVar11) || (bVar37)) break;
            uVar28 = uVar36;
            if (uVar14 < uVar36) {
              uVar28 = uVar14;
            }
            if (0x80 < uVar28) goto LAB_0010fbaf;
            puVar23 = ringbuffer + (uVar11 & uVar34);
            uVar25 = 0x80 - uVar28;
            uVar30 = (ulong)((uint)uVar25 & 0xf8);
            uVar22 = 0;
            lVar27 = 0;
LAB_0010f327:
            if (uVar25 >> 3 == uVar22) {
              uVar29 = (ulong)((uint)uVar25 & 7);
              puVar20 = puVar23 + (uVar28 - lVar27);
              for (; (bVar37 = uVar29 != 0, uVar29 = uVar29 - 1, uVar22 = uVar25, bVar37 &&
                     (uVar22 = uVar30, puVar35[uVar30 + uVar28] == *puVar20)); uVar30 = uVar30 + 1)
              {
                puVar20 = puVar20 + 1;
              }
            }
            else {
              if (*(ulong *)(puVar23 + uVar22 * 8 + uVar28) ==
                  *(ulong *)(puVar35 + uVar22 * 8 + uVar28)) goto code_r0x0010f33d;
              uVar22 = *(ulong *)(puVar35 + uVar22 * 8 + uVar28) ^
                       *(ulong *)(puVar23 + uVar22 * 8 + uVar28);
              uVar30 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar22 = (uVar30 >> 3 & 0x1fffffff) - lVar27;
            }
            uVar22 = uVar22 + uVar28;
            iVar10 = bcmp(puVar35,puVar23,uVar22);
            if (iVar10 != 0) goto LAB_0010fbce;
            local_2f50 = (uint)uVar19;
            if (0x7f < uVar22) {
              puVar15 = hasher->forest_;
              puVar15[local_2f70] = puVar15[(ulong)(local_2f50 & uVar11) * 2];
              uVar18 = puVar15[(ulong)(local_2f50 & uVar11) * 2 + 1];
              goto LAB_0010f453;
            }
            uVar28 = (ulong)(uVar11 & local_2f50) * 2;
            puVar15 = hasher->forest_;
            if (puVar23[uVar22] < puVar35[uVar22]) {
              puVar15[local_2f70] = uVar11;
              uVar28 = uVar28 | 1;
              uVar14 = uVar22;
              uVar22 = uVar36;
              local_2f70 = uVar28;
            }
            else {
              puVar15[local_2f68] = uVar11;
              local_2f68 = uVar28;
            }
            uVar36 = uVar22;
            uVar11 = puVar15[uVar28];
          }
          uVar18 = hasher->invalid_pos_;
          puVar15 = hasher->forest_;
          puVar15[local_2f70] = uVar18;
LAB_0010f453:
          puVar15[local_2f68] = uVar18;
        }
      }
      for (; uVar24 < uVar12; uVar24 = uVar24 + 1) {
        uVar19 = hasher->window_mask_;
        puVar35 = ringbuffer + (uVar24 & ringbuffer_mask);
        uVar9 = (uint)(*(int *)(ringbuffer + (uVar24 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
        uVar11 = hasher->buckets_[uVar9];
        local_2f68 = (uVar19 & uVar24) * 2 + 1;
        local_2f70 = (uVar19 & uVar24) * 2;
        hasher->buckets_[uVar9] = (uint32_t)uVar24;
        uVar26 = 0;
        lVar31 = 0x40;
        uVar14 = 0;
        while (uVar24 != uVar11) {
          bVar37 = lVar31 == 0;
          lVar31 = lVar31 + -1;
          if ((uVar19 - 0xf < uVar24 - uVar11) || (bVar37)) break;
          uVar36 = uVar14;
          if (uVar26 < uVar14) {
            uVar36 = uVar26;
          }
          if (0x80 < uVar36) goto LAB_0010fbaf;
          puVar23 = ringbuffer + (uVar11 & uVar34);
          uVar22 = 0x80 - uVar36;
          uVar28 = (ulong)((uint)uVar22 & 0xf8);
          uVar30 = 0;
          lVar27 = 0;
LAB_0010f555:
          if (uVar22 >> 3 == uVar30) {
            uVar25 = (ulong)((uint)uVar22 & 7);
            puVar20 = puVar23 + (uVar36 - lVar27);
            for (; (bVar37 = uVar25 != 0, uVar25 = uVar25 - 1, uVar30 = uVar22, bVar37 &&
                   (uVar30 = uVar28, puVar35[uVar28 + uVar36] == *puVar20)); uVar28 = uVar28 + 1) {
              puVar20 = puVar20 + 1;
            }
          }
          else {
            if (*(ulong *)(puVar23 + uVar30 * 8 + uVar36) ==
                *(ulong *)(puVar35 + uVar30 * 8 + uVar36)) goto code_r0x0010f56b;
            uVar30 = *(ulong *)(puVar35 + uVar30 * 8 + uVar36) ^
                     *(ulong *)(puVar23 + uVar30 * 8 + uVar36);
            uVar28 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar30 = (uVar28 >> 3 & 0x1fffffff) - lVar27;
          }
          uVar30 = uVar30 + uVar36;
          iVar10 = bcmp(puVar35,puVar23,uVar30);
          if (iVar10 != 0) goto LAB_0010fbce;
          local_2f40._0_4_ = (uint)uVar19;
          if (0x7f < uVar30) {
            puVar15 = hasher->forest_;
            puVar15[local_2f70] = puVar15[(ulong)((uint)local_2f40 & uVar11) * 2];
            uVar18 = puVar15[(ulong)((uint)local_2f40 & uVar11) * 2 + 1];
            goto LAB_0010f67c;
          }
          uVar36 = (ulong)(uVar11 & (uint)local_2f40) * 2;
          puVar15 = hasher->forest_;
          if (puVar23[uVar30] < puVar35[uVar30]) {
            puVar15[local_2f70] = uVar11;
            uVar36 = uVar36 | 1;
            uVar26 = uVar30;
            uVar30 = uVar14;
            local_2f70 = uVar36;
          }
          else {
            puVar15[local_2f68] = uVar11;
            local_2f68 = uVar36;
          }
          uVar14 = uVar30;
          uVar11 = puVar15[uVar36];
        }
        uVar18 = hasher->invalid_pos_;
        puVar15 = hasher->forest_;
        puVar15[local_2f70] = uVar18;
LAB_0010f67c:
        puVar15[local_2f68] = uVar18;
      }
      memset((void *)((long)local_2f18 + lVar16 * 4 + 4),0,lVar32 * 4);
      lVar16 = lVar16 + lVar32;
      uVar26 = local_2f10 + 1;
    }
    local_2f10 = uVar26;
    lVar16 = lVar16 + 1;
  } while( true );
code_r0x0010ecfc:
  lVar32 = lVar32 + -8;
  uVar30 = uVar30 + 1;
  goto LAB_0010ece5;
code_r0x0010eeaf:
  lVar31 = lVar31 + -8;
  uVar29 = uVar29 + 1;
  goto LAB_0010ee90;
code_r0x0010f33d:
  lVar27 = lVar27 + -8;
  uVar22 = uVar22 + 1;
  goto LAB_0010f327;
code_r0x0010f56b:
  lVar27 = lVar27 + -8;
  uVar30 = uVar30 + 1;
  goto LAB_0010f555;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(
    MemoryManager* m, size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, H10* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(hasher, ringbuffer, ringbuffer_mask,
        pos, max_length, max_distance, params, &matches[cur_match_pos]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      assert(BackwardMatchLength(&matches[j]) <
          BackwardMatchLength(&matches[j + 1]));
      assert(matches[j].distance > max_distance ||
             matches[j].distance <= matches[j + 1].distance);
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  InitZopfliCostModel(m, &model, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, dist_cache,
        &model, num_matches, matches, nodes);
    BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit,
        nodes, dist_cache, last_insert_len, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}